

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

int Sbd_ManFindCands(Sbd_Man_t *p,word *Cover,int nDivs)

{
  long lVar1;
  int Entry;
  word wVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  Vec_Int_t *p_00;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Vec_Int_t **ppVVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  ulong uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int Order [64];
  int Ones [64];
  int local_238 [3];
  undefined1 local_22c [244];
  uint local_138 [66];
  
  iVar12 = nDivs + 3;
  if (-1 < nDivs) {
    iVar12 = nDivs;
  }
  lVar11 = (long)nDivs;
  wVar2 = Cover[lVar11];
  uVar7 = (ulong)(uint)nDivs;
  if (nDivs < 8) {
    p_00 = p->vDivSet;
    p_00->nSize = 0;
    if (nDivs < 1) {
      return 0;
    }
LAB_00543391:
    ppVVar16 = &p->vDivSet;
    uVar3 = 0;
    while (Cover[uVar3] != wVar2) {
      uVar3 = uVar3 + 1;
      if (uVar7 == uVar3) {
        uVar5 = 1;
        uVar3 = 0;
        do {
          uVar8 = uVar3 + 1;
          if ((long)uVar8 < lVar11) {
            uVar24 = uVar5;
            do {
              if ((Cover[uVar24] | Cover[uVar3]) == wVar2) goto LAB_00543881;
              uVar24 = uVar24 + 1;
            } while (uVar7 != uVar24);
          }
          uVar5 = uVar5 + 1;
          uVar3 = uVar8;
          if (uVar8 == uVar7) {
            lVar6 = 2;
            uVar5 = 1;
            uVar3 = 0;
            do {
              uVar24 = uVar3 + 1;
              lVar13 = lVar6;
              uVar8 = uVar5;
              if ((long)uVar24 < lVar11) {
                do {
                  uVar17 = uVar8 + 1;
                  if ((int)uVar17 < nDivs) {
                    lVar25 = lVar13;
                    do {
                      if ((Cover[lVar25] | Cover[uVar8] | Cover[uVar3]) == wVar2) {
                        Vec_IntPush(p_00,(int)uVar3);
LAB_005438c1:
                        Vec_IntPush(*ppVVar16,(int)uVar8);
                        p_00 = *ppVVar16;
                        iVar19 = (int)lVar25;
                        goto LAB_00543894;
                      }
                      lVar25 = lVar25 + 1;
                    } while ((int)lVar25 < nDivs);
                  }
                  lVar13 = lVar13 + 1;
                  uVar8 = uVar17;
                } while (uVar17 != uVar7);
              }
              lVar6 = lVar6 + 1;
              uVar5 = uVar5 + 1;
              uVar3 = uVar24;
              if (uVar24 == uVar7) {
                iVar12 = 3;
                uVar5 = 2;
                uVar24 = 1;
                uVar3 = 0;
                do {
                  uVar17 = uVar3 + 1;
                  uVar8 = uVar5;
                  uVar4 = uVar24;
                  iVar19 = iVar12;
                  if ((long)uVar17 < lVar11) {
                    do {
                      uVar18 = uVar4 + 1;
                      uVar9 = uVar8 + 1;
                      if (((int)uVar18 < nDivs) && ((int)uVar9 < nDivs)) {
                        lVar6 = (long)iVar19;
                        uVar20 = uVar9;
                        do {
                          uVar14 = uVar20;
                          lVar25 = lVar6;
                          do {
                            if ((Cover[lVar25] | Cover[uVar8] | Cover[uVar4] | Cover[uVar3]) ==
                                wVar2) {
                              Vec_IntPush(p_00,(int)uVar3);
                              Vec_IntPush(*ppVVar16,(int)uVar4);
                              goto LAB_005438c1;
                            }
                            lVar25 = lVar25 + 1;
                          } while (lVar25 < lVar11);
                          lVar6 = lVar6 + 1;
                          uVar20 = uVar14 + 1;
                          uVar8 = uVar14;
                        } while ((int)uVar20 < nDivs);
                      }
                      iVar19 = iVar19 + 1;
                      uVar8 = uVar9;
                      uVar4 = uVar18;
                    } while (uVar18 != uVar7);
                  }
                  iVar12 = iVar12 + 1;
                  uVar5 = uVar5 + 1;
                  uVar24 = uVar24 + 1;
                  uVar3 = uVar17;
                  if (uVar17 == uVar7) {
                    return 0;
                  }
                } while( true );
              }
            } while( true );
          }
        } while( true );
      }
    }
  }
  else {
    ppVVar16 = &p->vDivSet;
    p_00 = p->vDivSet;
    iVar19 = p->pPars->fCover;
    p_00->nSize = 0;
    if (iVar19 != 0) goto LAB_00543391;
    uVar3 = 0;
    while (Cover[uVar3] != wVar2) {
      uVar3 = uVar3 + 1;
      if (uVar7 == uVar3) {
        uVar5 = 1;
        uVar3 = 0;
        do {
          uVar8 = uVar3 + 1;
          if ((long)uVar8 < lVar11) {
            uVar24 = uVar5;
            do {
              if ((Cover[uVar24] | Cover[uVar3]) == wVar2) goto LAB_00543881;
              uVar24 = uVar24 + 1;
            } while (uVar7 != uVar24);
          }
          uVar5 = uVar5 + 1;
          uVar3 = uVar8;
          if (uVar8 == uVar7) {
            uVar3 = 0;
            do {
              uVar5 = Cover[uVar3] - (Cover[uVar3] >> 1 & 0x5555555555555555);
              uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
              uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
              uVar5 = (uVar5 >> 8) + uVar5;
              lVar6 = (uVar5 >> 0x10) + uVar5;
              local_138[uVar3] = (int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xff;
              uVar3 = uVar3 + 1;
            } while (uVar7 != uVar3);
            lVar6 = uVar7 - 1;
            auVar26._8_4_ = (int)lVar6;
            auVar26._0_8_ = lVar6;
            auVar26._12_4_ = (int)((ulong)lVar6 >> 0x20);
            uVar7 = 0;
            auVar26 = auVar26 ^ _DAT_0094e250;
            auVar27 = _DAT_0094e240;
            do {
              auVar28 = auVar27 ^ _DAT_0094e250;
              if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                          auVar26._4_4_ < auVar28._4_4_) & 1)) {
                local_238[uVar7] = (int)uVar7;
              }
              if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
                  auVar28._12_4_ <= auVar26._12_4_) {
                local_238[uVar7 + 1] = (int)uVar7 + 1;
              }
              uVar7 = uVar7 + 2;
              lVar6 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 2;
              auVar27._8_8_ = lVar6 + 2;
            } while ((nDivs + 1U & 0xfffffffe) != uVar7);
            Vec_IntSelectSortCost2Reverse(local_238,nDivs,(int *)local_138);
            uVar3 = (ulong)(nDivs / 2 + 3);
            uVar5 = (ulong)(nDivs / 3 + 2);
            uVar24 = (ulong)((iVar12 >> 2) + 1);
            uVar17 = 2;
            uVar8 = 1;
            uVar7 = 0;
            do {
              uVar18 = uVar7 + 1;
              uVar4 = uVar17;
              uVar9 = uVar8;
              if (uVar18 < uVar5) {
                do {
                  uVar20 = uVar9 + 1;
                  if (uVar20 < uVar3) {
                    iVar12 = local_238[uVar9];
                    uVar9 = uVar4;
                    do {
                      iVar19 = local_238[uVar9];
                      if ((Cover[iVar19] | Cover[iVar12] | Cover[local_238[uVar7]]) == wVar2) {
                        Vec_IntPush(p_00,local_238[uVar7]);
                        p_00 = *ppVVar16;
                        goto LAB_00543889;
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar9 < uVar3);
                  }
                  uVar4 = uVar4 + 1;
                  uVar9 = uVar20;
                } while (uVar20 != uVar5);
              }
              uVar17 = uVar17 + 1;
              uVar8 = uVar8 + 1;
              uVar7 = uVar18;
              if (uVar18 == uVar24) {
                lVar6 = 3;
                uVar17 = 2;
                uVar8 = 1;
                puVar23 = local_22c;
                uVar7 = 0;
                do {
                  uVar4 = uVar7 + 1;
                  uVar9 = uVar8;
                  lVar13 = lVar6;
                  puVar22 = puVar23;
                  uVar18 = uVar17;
                  if (uVar4 < uVar5) {
                    do {
                      uVar20 = uVar9 + 1;
                      lVar25 = lVar13;
                      puVar21 = puVar22;
                      uVar14 = uVar18;
                      uVar15 = uVar20;
                      while (uVar15 < uVar3) {
                        uVar15 = uVar14 + 1;
                        if ((long)uVar15 < lVar11) {
                          iVar12 = local_238[uVar9];
                          Entry = local_238[uVar14];
                          lVar10 = 0;
                          do {
                            iVar19 = *(int *)(puVar21 + lVar10 * 4);
                            if ((Cover[iVar19] |
                                Cover[iVar12] | Cover[local_238[uVar7]] | Cover[Entry]) == wVar2) {
                              Vec_IntPush(p_00,local_238[uVar7]);
                              Vec_IntPush(*ppVVar16,iVar12);
                              Vec_IntPush(*ppVVar16,Entry);
                              p_00 = *ppVVar16;
                              goto LAB_00543894;
                            }
                            lVar1 = lVar25 + lVar10;
                            lVar10 = lVar10 + 1;
                          } while (lVar1 + 1 < lVar11);
                        }
                        lVar25 = lVar25 + 1;
                        puVar21 = puVar21 + 4;
                        uVar14 = uVar15;
                      }
                      lVar13 = lVar13 + 1;
                      uVar18 = uVar18 + 1;
                      puVar22 = puVar22 + 4;
                      uVar9 = uVar20;
                    } while (uVar20 != uVar5);
                  }
                  lVar6 = lVar6 + 1;
                  uVar17 = uVar17 + 1;
                  uVar8 = uVar8 + 1;
                  puVar23 = puVar23 + 4;
                  uVar7 = uVar4;
                  if (uVar4 == uVar24) {
                    return 0;
                  }
                } while( true );
              }
            } while( true );
          }
        } while( true );
      }
    }
  }
  iVar19 = (int)uVar3;
LAB_00543894:
  Vec_IntPush(p_00,iVar19);
  return 1;
LAB_00543881:
  iVar19 = (int)uVar24;
  iVar12 = (int)uVar3;
LAB_00543889:
  Vec_IntPush(p_00,iVar12);
  p_00 = p->vDivSet;
  goto LAB_00543894;
}

Assistant:

static inline int Sbd_ManFindCands( Sbd_Man_t * p, word Cover[64], int nDivs )
{
    int Ones[64], Order[64];
    int Limits[4] = { nDivs/4+1, nDivs/3+2, nDivs/2+3, nDivs };
    int c0, c1, c2, c3;
    word Target = Cover[nDivs];

    if ( nDivs < 8 || p->pPars->fCover )
        return Sbd_ManFindCandsSimple( p, Cover, nDivs );

    Vec_IntClear( p->vDivSet );
    for ( c0 = 0; c0 < nDivs; c0++ )
        if ( Cover[c0] == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            return 1;
        }

    for ( c0 = 0;    c0 < nDivs; c0++ )
    for ( c1 = c0+1; c1 < nDivs; c1++ )
        if ( (Cover[c0] | Cover[c1]) == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            Vec_IntPush( p->vDivSet, c1 );
            return 1;
        }

    // count ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Ones[c0] = Abc_TtCountOnes( Cover[c0] );

    // sort by the number of ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Order[c0] = c0;
    Vec_IntSelectSortCost2Reverse( Order, nDivs, Ones );

    // sort with limits
    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            return 1;
        }

    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
    for ( c3 = c2+1; c3 < Limits[3]; c3++ )
    {
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]] | Cover[Order[c3]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            Vec_IntPush( p->vDivSet, Order[c3] );
            return 1;
        }
    }
    return 0;
}